

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t> * __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::coboundary
          (directed_flag_complex_computer_t *this,filtration_entry_t cell)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  coefficient_t _coefficient;
  index_t iVar4;
  reference pvVar5;
  reference pvVar6;
  directed_flag_complex_computer_t *in_RSI;
  coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *in_RDI;
  size_t i;
  ulong local_18;
  
  if ((in_RSI->current_dimension <= (int)(uint)in_RSI->max_dimension) &&
     (bVar3 = is_top_dimension(in_RSI), !bVar3)) {
    local_18 = 0;
    while( true ) {
      bVar3 = false;
      if (local_18 < in_RSI->nb_threads - 1) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&in_RSI->coboundary_matrix_offsets,local_18 + 1);
        vVar2 = *pvVar5;
        iVar4 = get_index((filtration_entry_t *)0x1fd133);
        bVar3 = (int)vVar2 <= iVar4;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
    iVar1 = in_RSI->current_dimension;
    pvVar6 = std::
             vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
             ::operator[](&in_RSI->coboundary_matrix,local_18);
    iVar4 = get_index((filtration_entry_t *)0x1fd189);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RSI->coboundary_matrix_offsets,local_18);
    vVar2 = *pvVar5;
    _coefficient = get_coefficient((filtration_entry_t *)0x1fd1bd);
    coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
    coboundary_iterator_t
              (in_RDI,in_RSI,(short)iVar1,pvVar6,iVar4 - (int)vVar2,_coefficient,in_RSI->modulus);
    return in_RDI;
  }
  iVar1 = in_RSI->current_dimension;
  pvVar6 = std::
           vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
           operator[](&in_RSI->coboundary_matrix,0);
  coboundary_iterator_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
  coboundary_iterator_t(in_RDI,in_RSI,(short)iVar1,pvVar6,-1,1,in_RSI->modulus);
  return in_RDI;
}

Assistant:

inline coboundary_iterator_t<directed_flag_complex_computer_t> coboundary(filtration_entry_t cell) {
		if (current_dimension > max_dimension || is_top_dimension()) {
			return coboundary_iterator_t<directed_flag_complex_computer_t>(this, current_dimension,
			                                                               coboundary_matrix[0], -1, 1, modulus);
		}

		size_t i = 0;
		while (i < nb_threads - 1 && index_t(coboundary_matrix_offsets[i + 1]) <= get_index(cell)) { i++; }
		return coboundary_iterator_t<directed_flag_complex_computer_t>(
		    this, current_dimension, coboundary_matrix[i], get_index(cell) - index_t(coboundary_matrix_offsets[i]),
		    get_coefficient(cell), modulus);
	}